

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_decimal_utils.hpp
# Opt level: O3

hugeint_t duckdb::ParquetDecimalUtils::ReadDecimalValue<duckdb::hugeint_t>
                    (const_data_ptr_t pointer,idx_t size,ParquetColumnSchema *param_3)

{
  data_t dVar1;
  InvalidInputException *this;
  byte bVar2;
  idx_t iVar3;
  long lVar4;
  byte *pbVar5;
  idx_t iVar6;
  bool bVar7;
  hugeint_t hVar8;
  hugeint_t res;
  hugeint_t local_50;
  hugeint_t local_40;
  undefined1 local_30 [16];
  
  duckdb::hugeint_t::hugeint_t(&local_50,0);
  dVar1 = *pointer;
  iVar3 = 0x10;
  if (size < 0x10) {
    iVar3 = size;
  }
  if (size != 0) {
    bVar2 = (char)dVar1 >> 7;
    pbVar5 = pointer + size;
    iVar6 = 0;
    do {
      pbVar5 = pbVar5 + -1;
      *(byte *)((long)&local_50.lower + iVar6) = *pbVar5 ^ bVar2;
      iVar6 = iVar6 + 1;
    } while (iVar3 != iVar6);
    if (0x10 < size) {
      lVar4 = size - 0x11;
      do {
        if (pointer[lVar4] != bVar2) {
          this = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_40.lower = (uint64_t)local_30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"Invalid decimal encoding in Parquet file","");
          duckdb::InvalidInputException::InvalidInputException(this,(string *)&local_40);
          __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar7 = lVar4 != 0;
        lVar4 = lVar4 + -1;
      } while (bVar7);
    }
  }
  hVar8.upper = local_50.upper;
  hVar8.lower = local_50.lower;
  if ((char)dVar1 < '\0') {
    duckdb::hugeint_t::hugeint_t(&local_40,1);
    duckdb::hugeint_t::operator+=(&local_50,&local_40);
    hVar8 = (hugeint_t)duckdb::hugeint_t::operator-(&local_50);
  }
  return hVar8;
}

Assistant:

static PHYSICAL_TYPE ReadDecimalValue(const_data_ptr_t pointer, idx_t size, const ParquetColumnSchema &) {
		PHYSICAL_TYPE res = 0;

		auto res_ptr = (uint8_t *)&res;
		bool positive = (*pointer & 0x80) == 0;

		// numbers are stored as two's complement so some muckery is required
		for (idx_t i = 0; i < MinValue<idx_t>(size, sizeof(PHYSICAL_TYPE)); i++) {
			auto byte = *(pointer + (size - i - 1));
			res_ptr[i] = positive ? byte : byte ^ 0xFF;
		}
		// Verify that there are only 0s here
		if (size > sizeof(PHYSICAL_TYPE)) {
			for (idx_t i = sizeof(PHYSICAL_TYPE); i < size; i++) {
				auto byte = *(pointer + (size - i - 1));
				if (!positive) {
					byte ^= 0xFF;
				}
				if (byte != 0) {
					throw InvalidInputException("Invalid decimal encoding in Parquet file");
				}
			}
		}
		if (!positive) {
			res += 1;
			return -res;
		}
		return res;
	}